

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpConsole.cpp
# Opt level: O0

char * __thiscall gnl::FtpConsole::getCommand(FtpConsole *this,char *buf,char *command)

{
  bool bVar1;
  char *data;
  int j;
  int i;
  char *command_local;
  char *buf_local;
  FtpConsole *this_local;
  
  for (command_local = buf; *command_local == ' '; command_local = command_local + 1) {
  }
  data._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (((*command_local != ' ') && (bVar1 = false, *command_local != '\r')) &&
       (bVar1 = false, *command_local != '\n')) {
      bVar1 = *command_local != '\0';
    }
    if (!bVar1) break;
    command[data._4_4_] = *command_local;
    data._4_4_ = data._4_4_ + 1;
    command_local = command_local + 1;
  }
  command[data._4_4_] = '\0';
  for (; *command_local == ' '; command_local = command_local + 1) {
  }
  data._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (command_local[data._4_4_] != '\r') {
      bVar1 = command_local[data._4_4_] != '\n';
    }
    if (!bVar1) break;
    data._4_4_ = data._4_4_ + 1;
  }
  command_local[data._4_4_] = '\0';
  return command_local;
}

Assistant:

char* FtpConsole::getCommand(char* buf, char* command){
        while(*buf == ' '){
            ++buf;
        }
        int i = 0,j = 0;
        while(*buf != ' ' && *buf != '\r' && *buf != '\n' && *buf != '\0'){
            command[i] = *buf++;
            ++i;
        }
        command[i] = '\0';
        while(*buf == ' '){
            ++buf;
        }
        char* data = buf;
        i = 0;
        while(buf[i] != '\r' && buf[i] != '\n'){
            ++i;
        }
        buf[i] = '\0';
        return data;
    }